

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O1

void Io_WriteTimingInfo(FILE *pFile,Abc_Ntk_t *pNtk)

{
  float fVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  Abc_Time_t *pAVar4;
  Abc_Time_t *pAVar5;
  Abc_Time_t *pAVar6;
  char *pcVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    return;
  }
  fputc(10,(FILE *)pFile);
  fVar1 = pNtk->AndGateDelay;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fprintf((FILE *)pFile,".and_gate_delay %g\n",(double)fVar1);
  }
  pAVar4 = Abc_NtkReadDefaultArrival(pNtk);
  fprintf((FILE *)pFile,".default_input_arrival %g %g\n",(double)pAVar4->Rise,(double)pAVar4->Fall);
  pAVar5 = Abc_NtkReadDefaultRequired(pNtk);
  fprintf((FILE *)pFile,".default_output_required %g %g\n",(double)pAVar5->Rise);
  fputc(10,(FILE *)pFile);
  pVVar8 = pNtk->vPis;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar8->pArray[lVar9];
      pAVar6 = Abc_NodeReadArrival(pAVar2);
      if ((pAVar6->Rise != pAVar4->Rise) || (NAN(pAVar6->Rise) || NAN(pAVar4->Rise))) {
LAB_0033d5fe:
        pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray]);
        fprintf((FILE *)pFile,".input_arrival %s %g %g\n",(double)pAVar6->Rise,pcVar7);
      }
      else if ((pAVar6->Fall != pAVar4->Fall) || (NAN(pAVar6->Fall) || NAN(pAVar4->Fall)))
      goto LAB_0033d5fe;
      lVar9 = lVar9 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar9 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vPos;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar8->pArray[lVar9];
      pAVar4 = Abc_NodeReadRequired(pAVar2);
      if ((pAVar4->Rise != pAVar5->Rise) || (NAN(pAVar4->Rise) || NAN(pAVar5->Rise))) {
LAB_0033d694:
        pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
        fprintf((FILE *)pFile,".output_required %s %g %g\n",(double)pAVar4->Rise,pcVar7);
      }
      else if ((pAVar4->Fall != pAVar5->Fall) || (NAN(pAVar4->Fall) || NAN(pAVar5->Fall)))
      goto LAB_0033d694;
      lVar9 = lVar9 + 1;
      pVVar8 = pNtk->vPos;
    } while (lVar9 < pVVar8->nSize);
  }
  fputc(10,(FILE *)pFile);
  pAVar4 = Abc_NtkReadDefaultInputDrive(pNtk);
  fVar1 = pAVar4->Rise;
  if ((((fVar1 != 0.0) || (NAN(fVar1))) || (pAVar4->Fall != 0.0)) || (NAN(pAVar4->Fall))) {
    fprintf((FILE *)pFile,".default_input_drive %g %g\n",(double)fVar1);
  }
  pAVar5 = Abc_NodeReadInputDrive(pNtk,0);
  if ((pAVar5 != (Abc_Time_t *)0x0) && (pVVar8 = pNtk->vPis, 0 < pVVar8->nSize)) {
    lVar9 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar9];
      pAVar5 = Abc_NodeReadInputDrive(pNtk,(int)lVar9);
      if ((pAVar5->Rise != pAVar4->Rise) || (NAN(pAVar5->Rise) || NAN(pAVar4->Rise))) {
LAB_0033d793:
        pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)plVar3[6] * 8));
        fprintf((FILE *)pFile,".input_drive %s %g %g\n",(double)pAVar5->Rise,pcVar7);
      }
      else if ((pAVar5->Fall != pAVar4->Fall) || (NAN(pAVar5->Fall) || NAN(pAVar4->Fall)))
      goto LAB_0033d793;
      lVar9 = lVar9 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar9 < pVVar8->nSize);
  }
  pAVar4 = Abc_NtkReadDefaultOutputLoad(pNtk);
  fVar1 = pAVar4->Rise;
  if ((((fVar1 != 0.0) || (NAN(fVar1))) || (pAVar4->Fall != 0.0)) || (NAN(pAVar4->Fall))) {
    fprintf((FILE *)pFile,".default_output_load %g %g\n",(double)fVar1,(double)pAVar4->Fall);
  }
  pAVar5 = Abc_NodeReadOutputLoad(pNtk,0);
  if ((pAVar5 != (Abc_Time_t *)0x0) && (pVVar8 = pNtk->vPos, 0 < pVVar8->nSize)) {
    lVar9 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar9];
      pAVar5 = Abc_NodeReadOutputLoad(pNtk,(int)lVar9);
      if ((pAVar5->Rise != pAVar4->Rise) || (NAN(pAVar5->Rise) || NAN(pAVar4->Rise))) {
LAB_0033d87f:
        pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)plVar3[4] * 8));
        fprintf((FILE *)pFile,".output_load %s %g %g\n",(double)pAVar5->Rise,(double)pAVar5->Fall,
                pcVar7);
      }
      else if ((pAVar5->Fall != pAVar4->Fall) || (NAN(pAVar5->Fall) || NAN(pAVar4->Fall)))
      goto LAB_0033d87f;
      lVar9 = lVar9 + 1;
      pVVar8 = pNtk->vPos;
    } while (lVar9 < pVVar8->nSize);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Io_WriteTimingInfo( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Abc_Time_t * pTime, * pTimeDefIn, * pTimeDefOut;
    int i;

    if ( pNtk->pManTime == NULL )
        return;

    fprintf( pFile, "\n" );
    if ( pNtk->AndGateDelay != 0.0 )
        fprintf( pFile, ".and_gate_delay %g\n", pNtk->AndGateDelay );
    pTimeDefIn = Abc_NtkReadDefaultArrival( pNtk );
    //if ( pTimeDefIn->Rise != 0.0 || pTimeDefIn->Fall != 0.0 )
        fprintf( pFile, ".default_input_arrival %g %g\n", pTimeDefIn->Rise, pTimeDefIn->Fall );
    pTimeDefOut = Abc_NtkReadDefaultRequired( pNtk );
    //if ( pTimeDefOut->Rise != ABC_INFINITY || pTimeDefOut->Fall != ABC_INFINITY )
        fprintf( pFile, ".default_output_required %g %g\n", pTimeDefOut->Rise, pTimeDefOut->Fall );

    fprintf( pFile, "\n" );
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pTime = Abc_NodeReadArrival(pNode);
        if ( pTime->Rise == pTimeDefIn->Rise && pTime->Fall == pTimeDefIn->Fall )
            continue;
        fprintf( pFile, ".input_arrival %s %g %g\n", Abc_ObjName(Abc_ObjFanout0(pNode)), pTime->Rise, pTime->Fall );
    }
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pTime = Abc_NodeReadRequired(pNode);
        if ( pTime->Rise == pTimeDefOut->Rise && pTime->Fall == pTimeDefOut->Fall )
            continue;
        fprintf( pFile, ".output_required %s %g %g\n", Abc_ObjName(Abc_ObjFanin0(pNode)), pTime->Rise, pTime->Fall );
    }

    fprintf( pFile, "\n" );
    pTimeDefIn = Abc_NtkReadDefaultInputDrive( pNtk );
    if ( pTimeDefIn->Rise != 0.0 || pTimeDefIn->Fall != 0.0 )
        fprintf( pFile, ".default_input_drive %g %g\n", pTimeDefIn->Rise, pTimeDefIn->Fall );
    if ( Abc_NodeReadInputDrive( pNtk, 0 ) )
        Abc_NtkForEachPi( pNtk, pNode, i )
        {
            pTime = Abc_NodeReadInputDrive( pNtk, i );
            if ( pTime->Rise == pTimeDefIn->Rise && pTime->Fall == pTimeDefIn->Fall )
                continue;
            fprintf( pFile, ".input_drive %s %g %g\n", Abc_ObjName(Abc_ObjFanout0(pNode)), pTime->Rise, pTime->Fall );
        }

    pTimeDefOut = Abc_NtkReadDefaultOutputLoad( pNtk );
    if ( pTimeDefOut->Rise != 0.0 || pTimeDefOut->Fall != 0.0 )
        fprintf( pFile, ".default_output_load %g %g\n", pTimeDefOut->Rise, pTimeDefOut->Fall );
    if ( Abc_NodeReadOutputLoad( pNtk, 0 ) )
        Abc_NtkForEachPo( pNtk, pNode, i )
        {
            pTime = Abc_NodeReadOutputLoad( pNtk, i );
            if ( pTime->Rise == pTimeDefOut->Rise && pTime->Fall == pTimeDefOut->Fall )
                continue;
            fprintf( pFile, ".output_load %s %g %g\n", Abc_ObjName(Abc_ObjFanin0(pNode)), pTime->Rise, pTime->Fall );
        }

    fprintf( pFile, "\n" );
}